

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::DictionaryTypeHandlerBase<int>::SetAllPropertiesToUndefined
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,bool invalidateFixedFields)

{
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar1;
  PropertyRecord *pPVar2;
  JavascriptLibrary *pJVar3;
  JavascriptFunction *pJVar4;
  JavascriptFunction *value;
  int iVar5;
  PropertyRecord **ppPVar6;
  DictionaryPropertyDescriptor<int> *pDVar7;
  undefined7 in_register_00000011;
  JavascriptFunction *value_00;
  int iVar8;
  int propertyIndex;
  int iVar9;
  
  DynamicTypeHandler::ChangeFlags(&this->super_DynamicTypeHandler,0xc1,'\x01');
  pBVar1 = (this->propertyMap).ptr;
  iVar8 = pBVar1->count - pBVar1->freeCount;
  if (((int)CONCAT71(in_register_00000011,invalidateFixedFields) != 0) && (0 < iVar8)) {
    iVar9 = 0;
    do {
      ppPVar6 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::GetKeyAt((this->propertyMap).ptr,iVar9);
      pPVar2 = *ppPVar6;
      pDVar7 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetReferenceAt((this->propertyMap).ptr,iVar9);
      InvalidateFixedField<int>(this,instance,pPVar2->pid,pDVar7);
      iVar9 = iVar9 + 1;
    } while (iVar8 != iVar9);
  }
  if (0 < iVar8) {
    pJVar3 = (((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
    pJVar4 = (JavascriptFunction *)(pJVar3->super_JavascriptLibraryBase).undefinedValue.ptr;
    value = (pJVar3->super_JavascriptLibraryBase).defaultAccessorFunction.ptr;
    iVar9 = 0;
    do {
      pDVar7 = JsUtil::
               BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::GetReferenceAt((this->propertyMap).ptr,iVar9);
      iVar5 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(pDVar7);
      value_00 = pJVar4;
      if (iVar5 == -1) {
        iVar5 = DictionaryPropertyDescriptor<int>::GetGetterPropertyIndex(pDVar7);
        DynamicTypeHandler::SetSlotUnchecked(instance,iVar5,value);
        iVar5 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDVar7);
        value_00 = value;
      }
      DynamicTypeHandler::SetSlotUnchecked(instance,iVar5,value_00);
      iVar9 = iVar9 + 1;
    } while (iVar8 != iVar9);
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetAllPropertiesToUndefined(DynamicObject* instance, bool invalidateFixedFields)
    {
        // The Var for window is reused across navigation. we shouldn't preserve the IsExtensibleFlag when we don't keep
        // the expandos. Reset the IsExtensibleFlag in cleanup scenario should be good enough
        // to cover all the preventExtension/Freeze/Seal scenarios.
        // Note that we don't change the flag for keepProperties scenario: the flags should be preserved and that's consistent
        // with other browsers.
        ChangeFlags(IsExtensibleFlag | IsSealedOnceFlag | IsFrozenOnceFlag, IsExtensibleFlag);

        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.
        int propertyCount = this->propertyMap->Count();

#if ENABLE_FIXED_FIELDS
        if (invalidateFixedFields)
        {
            for (int propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
            {
                const PropertyRecord* propertyRecord = this->propertyMap->GetKeyAt(propertyIndex);
                DictionaryPropertyDescriptor<T>* descriptor = this->propertyMap->GetReferenceAt(propertyIndex);
                InvalidateFixedField(instance, propertyRecord->GetPropertyId(), descriptor);
            }
        }
#endif

        Js::RecyclableObject* undefined = instance->GetLibrary()->GetUndefined();
        Js::JavascriptFunction* defaultAccessor = instance->GetLibrary()->GetDefaultAccessorFunction();
        for (int propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
        {
            DictionaryPropertyDescriptor<T>* descriptor = this->propertyMap->GetReferenceAt(propertyIndex);

            T dataPropertyIndex = descriptor->template GetDataPropertyIndex<false>();
            if (dataPropertyIndex != NoSlots)
            {
                SetSlotUnchecked(instance, dataPropertyIndex, undefined);
            }
            else
            {
                SetSlotUnchecked(instance, descriptor->GetGetterPropertyIndex(), defaultAccessor);
                SetSlotUnchecked(instance, descriptor->GetSetterPropertyIndex(), defaultAccessor);
            }
        }
    }